

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

void linearize_store_var(Proc *proc,VariableType *var_type,Pseudo *var_pseudo,VariableType *val_type
                        ,Pseudo *val_pseudo,uint line_number)

{
  uint uVar1;
  ravitype_t rVar2;
  ravitype_t rVar3;
  Pseudo *pPVar4;
  Pseudo *ptr;
  C_MemoryAllocator *pCVar5;
  char cVar6;
  undefined1 *ptr_00;
  byte *ptr_01;
  Pseudo *pseudo;
  opcode op;
  byte bVar7;
  
  if (((undefined1  [48])*var_pseudo & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
    rVar3 = var_type->type_code;
    if (rVar3 != RAVI_TANY) {
      if ((rVar3 == RAVI_TVARARGS) || (rVar3 == RAVI_TNIL)) {
        __assert_fail("var_type->type_code != RAVI_TVARARGS && var_type->type_code != RAVI_TNIL",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x6c9,
                      "void linearize_store_var(Proc *, const VariableType *, Pseudo *, const VariableType *, Pseudo *, unsigned int)"
                     );
      }
      uVar1 = (uint)(rVar3 + ~RAVI_TBOOLEAN) >> 3;
      if ((((((uint)(uVar1 | rVar3 << 0x1d) < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) ||
           (val_type->type_code != RAVI_TNIL)) &&
          ((rVar2 = val_type->type_code, rVar2 != rVar3 ||
           (val_type->type_name != var_type->type_name)))) &&
         ((rVar2 != RAVI_TNUMINT || rVar3 != RAVI_TNUMFLT &&
          (rVar2 != RAVI_TNUMFLT || rVar3 != RAVI_TNUMINT)))) {
        instruct_totype(proc,val_pseudo,var_type,line_number);
        val_type = var_type;
      }
    }
    if (var_type->type_code == RAVI_TNUMFLT) {
      op = val_type->type_code == RAVI_TNUMFLT | op_movif;
    }
    else {
      op = op_mov;
      if (var_type->type_code == RAVI_TNUMINT) {
        op = (uint)(val_type->type_code != RAVI_TNUMINT) * 3 + op_movi;
      }
    }
    instruct_move(proc,op,var_pseudo,val_pseudo,line_number);
    return;
  }
  if ((undefined1  [40])((undefined1  [40])var_pseudo->field_3 & (undefined1  [40])0x100000000) ==
      (undefined1  [40])0x0) {
    uVar1 = (var_pseudo->field_3).range_in_use;
    if (uVar1 == 0x40) {
      bVar7 = val_type->type_code == RAVI_TNUMFLT | 0x46;
    }
    else if (uVar1 == 0x20) {
      bVar7 = val_type->type_code == RAVI_TNUMINT | 0x44;
    }
    else {
      rVar3 = (var_pseudo->field_3).index_info.key_type;
      cVar6 = (uVar1 == 0x80) * '\x03';
      bVar7 = cVar6 + 0x3e;
      if (rVar3 == RAVI_TSTRING) {
        bVar7 = cVar6 + 0x40;
      }
      else if (rVar3 == RAVI_TNUMINT) {
        bVar7 = cVar6 + 0x3f;
      }
    }
    pPVar4 = (var_pseudo->field_3).index_info.container;
    if (((undefined1  [48])*pPVar4 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x5b4,"void indexed_store(Proc *, Pseudo *, Pseudo *, ravitype_t)");
    }
    ptr = (var_pseudo->field_3).index_info.key;
    if (((undefined1  [48])*ptr & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x5b5,"void indexed_store(Proc *, Pseudo *, Pseudo *, ravitype_t)");
    }
    uVar1 = (var_pseudo->field_3).index_info.line_number;
    pCVar5 = proc->linearizer->compiler_state->allocator;
    ptr_01 = (byte *)(*pCVar5->calloc)(pCVar5->arena,1,0x28);
    *ptr_01 = bVar7;
    *(uint *)(ptr_01 + 0x20) = uVar1;
    if (((undefined1  [48])*val_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      pseudo = indexed_load(proc,val_pseudo);
      val_pseudo = pseudo;
    }
    else {
      pseudo = (Pseudo *)0x0;
    }
    raviX_ptrlist_add((PtrList **)(ptr_01 + 8),val_pseudo,
                      proc->linearizer->compiler_state->allocator);
    if (((undefined1  [48])*pPVar4 & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
      raviX_ptrlist_add((PtrList **)(ptr_01 + 0x10),pPVar4,
                        proc->linearizer->compiler_state->allocator);
      if (((undefined1  [48])*ptr & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
        raviX_ptrlist_add((PtrList **)(ptr_01 + 0x10),ptr,
                          proc->linearizer->compiler_state->allocator);
        if ((*(BasicBlock **)(ptr_01 + 0x18) != (BasicBlock *)0x0) &&
           (*(BasicBlock **)(ptr_01 + 0x18) != proc->current_bb)) {
LAB_0011c84f:
          __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0x1b1,"void add_instruction(Proc *, Instruction *)");
        }
        raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr_01,
                          proc->linearizer->compiler_state->allocator);
        *(BasicBlock **)(ptr_01 + 0x18) = proc->current_bb;
LAB_0011c7e2:
        if (pseudo != (Pseudo *)0x0) {
          free_temp_pseudo(proc,pseudo,false);
          return;
        }
        return;
      }
    }
  }
  else {
    uVar1 = (var_pseudo->field_3).index_info.line_number;
    pCVar5 = proc->linearizer->compiler_state->allocator;
    ptr_00 = (undefined1 *)(*pCVar5->calloc)(pCVar5->arena,1,0x28);
    *ptr_00 = 0x5a;
    *(uint *)(ptr_00 + 0x20) = uVar1;
    if (((undefined1  [48])*val_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      pseudo = indexed_load(proc,val_pseudo);
      val_pseudo = pseudo;
    }
    else {
      pseudo = (Pseudo *)0x0;
    }
    raviX_ptrlist_add((PtrList **)(ptr_00 + 8),val_pseudo,
                      proc->linearizer->compiler_state->allocator);
    pPVar4 = (var_pseudo->field_3).index_info.container;
    if (((undefined1  [48])*pPVar4 & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
      raviX_ptrlist_add((PtrList **)(ptr_00 + 0x10),pPVar4,
                        proc->linearizer->compiler_state->allocator);
      pPVar4 = (var_pseudo->field_3).index_info.key;
      if (((undefined1  [48])*pPVar4 & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
        raviX_ptrlist_add((PtrList **)(ptr_00 + 0x10),pPVar4,
                          proc->linearizer->compiler_state->allocator);
        if ((*(BasicBlock **)(ptr_00 + 0x18) != (BasicBlock *)0x0) &&
           (*(BasicBlock **)(ptr_00 + 0x18) != proc->current_bb)) goto LAB_0011c84f;
        raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr_00,
                          proc->linearizer->compiler_state->allocator);
        *(BasicBlock **)(ptr_00 + 0x18) = proc->current_bb;
        goto LAB_0011c7e2;
      }
    }
  }
  __assert_fail("pseudo->type != PSEUDO_INDEXED",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
}

Assistant:

static void linearize_store_var(Proc *proc, const VariableType *var_type, Pseudo *var_pseudo,
				const VariableType *val_type, Pseudo *val_pseudo, unsigned line_number)
{
	if (var_pseudo->type == PSEUDO_INDEXED) {
		indexed_store(proc, var_pseudo, val_pseudo, val_type->type_code);
	}
	else {
		assert(var_type->type_code != RAVI_TVARARGS && var_type->type_code != RAVI_TNIL);
		if (!is_compatible(var_type, val_type)) {
			instruct_totype(proc, val_pseudo, var_type, line_number);
			val_type = var_type; // Because of the type assertion!
		}
		enum opcode op = op_mov;
		if (var_type->type_code == RAVI_TNUMINT) {
			op = val_type->type_code == RAVI_TNUMINT ? op_movi : op_movfi;
		} else if (var_type->type_code == RAVI_TNUMFLT) {
			op = val_type->type_code == RAVI_TNUMFLT ? op_movf : op_movif;
		}
		instruct_move(proc, op, var_pseudo, val_pseudo, line_number);
	}
}